

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall
JsonParser_serialize_fu32_string_Test::TestBody(JsonParser_serialize_fu32_string_Test *this)

{
  char *pcVar1;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string;
  json_parser parser;
  string serialized_bytes;
  string fu32text;
  AssertHelper aAStack_a8 [8];
  long *local_a0;
  char *local_98;
  code *local_90;
  undefined1 local_88 [32];
  string local_68;
  undefined1 local_48 [64];
  
  local_90 = __cxa_guard_release;
  in_string._M_str = L"\"\\\"text\\\"\"";
  in_string._M_len = 10;
  make_foreign_string<char32_t>(&local_68,in_string);
  local_a0 = (long *)&DAT_00000006;
  local_98 = "\"text\"";
  jessilib::object::object((object *)local_48,(basic_string_view *)&local_a0);
  jessilib::json_parser::serialize_bytes_abi_cxx11_((object *)local_88,(text_encoding)&local_90);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)local_48);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_48,"serialized_bytes","fu32text",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,&local_68
            );
  if ((bool)local_48[0] == false) {
    testing::Message::Message((Message *)&local_a0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_48._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x141,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(aAStack_a8);
    if (local_a0 != (long *)0x0) {
      (**(code **)(*local_a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_48 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_
                );
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(JsonParser, serialize_boolean) {
	json_parser parser;

	EXPECT_EQ(parser.serialize<char8_t>(true), u8"true");
	EXPECT_EQ(parser.serialize<char8_t>(false), u8"false");
}